

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_> __thiscall
wabt::MakeUnique<wabt::EventImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  EventImport *this_00;
  
  this_00 = (EventImport *)operator_new(0xf0);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  EventImport::EventImport(this_00,name);
  *(EventImport **)this = this_00;
  return (__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>)
         (__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}